

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> * __thiscall
cmGlobalGenerator::CreateQtAutoGeneratorsTargets
          (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           *__return_storage_ptr__,cmGlobalGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  cmMakefile *this_00;
  iterator __position;
  bool bVar2;
  size_type sVar3;
  cmGlobalGenerator *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  TargetType TVar9;
  int iVar10;
  pointer ppcVar11;
  char *pcVar12;
  bool bVar13;
  pointer ppcVar14;
  ulong uVar15;
  cmGeneratorTarget *gt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> filteredTargets;
  string qtMajorVersion;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  allocator local_f9;
  undefined1 local_f8 [32];
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_d8;
  string local_c0;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_a0;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *local_88;
  string local_80;
  string local_60;
  cmGlobalGenerator *local_40;
  ulong local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppcVar11 = (this->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar11) {
    uVar15 = 0;
    local_88 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
               __return_storage_ptr__;
    local_40 = this;
    do {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_a0,&ppcVar11[uVar15]->GeneratorTargets);
      local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_start = (cmGeneratorTarget **)0x0;
      local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (cmGeneratorTarget **)0x0;
      local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (cmGeneratorTarget **)0x0;
      local_38 = uVar15;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::reserve
                (&local_d8,
                 (long)local_a0.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a0.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      for (ppcVar14 = local_a0.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; uVar15 = local_38, pcVar4 = local_40
          , ppcVar14 !=
            local_a0.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppcVar14 = ppcVar14 + 1) {
        TVar9 = cmGeneratorTarget::GetType(*ppcVar14);
        if ((TVar9 != GLOBAL_TARGET) &&
           ((((TVar9 = cmGeneratorTarget::GetType(*ppcVar14), TVar9 == EXECUTABLE ||
              (TVar9 = cmGeneratorTarget::GetType(*ppcVar14), TVar9 == STATIC_LIBRARY)) ||
             (TVar9 = cmGeneratorTarget::GetType(*ppcVar14), TVar9 == SHARED_LIBRARY)) ||
            ((TVar9 = cmGeneratorTarget::GetType(*ppcVar14), TVar9 == MODULE_LIBRARY ||
             (TVar9 = cmGeneratorTarget::GetType(*ppcVar14), TVar9 == OBJECT_LIBRARY)))))) {
          pcVar1 = *ppcVar14;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"AUTOMOC","");
          bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_c0);
          if (bVar5) {
LAB_003a2c94:
            bVar6 = false;
LAB_003a2c97:
            bVar2 = bVar6;
            bVar13 = !bVar5;
            bVar7 = cmGeneratorTarget::IsImported(*ppcVar14);
          }
          else {
            pcVar1 = *ppcVar14;
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"AUTOUIC","");
            bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_60);
            if (bVar6) goto LAB_003a2c94;
            pcVar1 = *ppcVar14;
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"AUTORCC","");
            __return_storage_ptr__ =
                 (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                 local_88;
            bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_80);
            bVar2 = true;
            bVar13 = true;
            bVar7 = true;
            bVar6 = true;
            if (bVar8) goto LAB_003a2c97;
          }
          if ((bVar2) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2)) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((bVar13) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2)) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._0_8_ + 1);
          }
          if (bVar7 == false) {
            this_00 = (*ppcVar14)->Target->Makefile;
            local_f8._0_8_ = local_f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,"QT_VERSION_MAJOR","");
            pcVar12 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f8);
            std::__cxx11::string::string((string *)&local_c0,pcVar12,&local_f9);
            if ((cmGeneratorTarget *)local_f8._0_8_ != (cmGeneratorTarget *)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            }
            iVar10 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar10 == 0) {
              local_f8._0_8_ = local_f8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_f8,"Qt5Core_VERSION_MAJOR","");
              pcVar12 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f8);
              sVar3 = local_c0._M_string_length;
              strlen(pcVar12);
              std::__cxx11::string::_M_replace((ulong)&local_c0,0,(char *)sVar3,(ulong)pcVar12);
              if ((cmGeneratorTarget *)local_f8._0_8_ != (cmGeneratorTarget *)(local_f8 + 0x10)) {
                operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
              }
            }
            iVar10 = std::__cxx11::string::compare((char *)&local_c0);
            if ((iVar10 == 0) ||
               (iVar10 = std::__cxx11::string::compare((char *)&local_c0), iVar10 == 0)) {
              local_f8._0_8_ = *ppcVar14;
              cmQtAutoGeneratorInitializer::InitializeAutogenSources
                        ((cmGeneratorTarget *)local_f8._0_8_);
              if (local_d8.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_d8.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
                _M_realloc_insert<cmGeneratorTarget*const&>
                          ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)
                           &local_d8,
                           (iterator)
                           local_d8.
                           super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(cmGeneratorTarget **)local_f8
                          );
              }
              else {
                *local_d8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish = (cmGeneratorTarget *)local_f8._0_8_;
                local_d8.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_d8.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._0_8_ + 1);
            }
          }
        }
      }
      ppcVar14 = local_d8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmQtAutoGeneratorInitializer::InitializeAutogenTarget
                    ((pcVar4->LocalGenerators).
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar15],*ppcVar14);
          __position._M_current = *(cmGeneratorTarget ***)((long)__return_storage_ptr__ + 8);
          if (__position._M_current == *(cmGeneratorTarget ***)((long)__return_storage_ptr__ + 0x10)
             ) {
            std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
            _M_realloc_insert<cmGeneratorTarget_const*const&>
                      ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                       __return_storage_ptr__,__position,ppcVar14);
          }
          else {
            *__position._M_current = *ppcVar14;
            *(long *)((long)__return_storage_ptr__ + 8) =
                 *(long *)((long)__return_storage_ptr__ + 8) + 8;
          }
          ppcVar14 = ppcVar14 + 1;
        } while (ppcVar14 !=
                 local_d8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (cmGeneratorTarget **)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      ppcVar11 = (pcVar4->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(pcVar4->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar11 >> 3
                             ));
  }
  return (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
         (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
         __return_storage_ptr__;
}

Assistant:

std::vector<const cmGeneratorTarget*>
cmGlobalGenerator::CreateQtAutoGeneratorsTargets()
{
  std::vector<const cmGeneratorTarget*> autogenTargets;

#ifdef CMAKE_BUILD_WITH_CMAKE
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    std::vector<cmGeneratorTarget*> targets =
      this->LocalGenerators[i]->GetGeneratorTargets();
    std::vector<cmGeneratorTarget*> filteredTargets;
    filteredTargets.reserve(targets.size());
    for(std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      if ((*ti)->GetType() == cmState::GLOBAL_TARGET)
        {
        continue;
        }
      if((*ti)->GetType() != cmState::EXECUTABLE &&
         (*ti)->GetType() != cmState::STATIC_LIBRARY &&
         (*ti)->GetType() != cmState::SHARED_LIBRARY &&
         (*ti)->GetType() != cmState::MODULE_LIBRARY &&
         (*ti)->GetType() != cmState::OBJECT_LIBRARY)
        {
        continue;
        }
      if((!(*ti)->GetPropertyAsBool("AUTOMOC")
            && !(*ti)->GetPropertyAsBool("AUTOUIC")
            && !(*ti)->GetPropertyAsBool("AUTORCC"))
          || (*ti)->IsImported())
        {
        continue;
        }
      // don't do anything if there is no Qt4 or Qt5Core (which contains moc):
      cmMakefile* mf = (*ti)->Target->GetMakefile();
      std::string qtMajorVersion = mf->GetSafeDefinition("QT_VERSION_MAJOR");
      if (qtMajorVersion == "")
        {
        qtMajorVersion = mf->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
        }
      if (qtMajorVersion != "4" && qtMajorVersion != "5")
        {
        continue;
        }

      cmGeneratorTarget* gt = *ti;

      cmQtAutoGeneratorInitializer::InitializeAutogenSources(gt);
      filteredTargets.push_back(gt);
      }
    for(std::vector<cmGeneratorTarget*>::iterator ti = filteredTargets.begin();
        ti != filteredTargets.end(); ++ti)
      {
      cmQtAutoGeneratorInitializer::InitializeAutogenTarget(
           this->LocalGenerators[i], *ti);
      autogenTargets.push_back(*ti);
      }
    }
#endif
  return autogenTargets;
}